

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_builder.h
# Opt level: O3

MyGame_Example_Monster_ref_t
MyGame_Example_Monster_clone(flatbuffers_builder_t *B,MyGame_Example_Monster_table_t t)

{
  uint uVar1;
  flatcc_refmap_ref_t fVar2;
  int iVar3;
  MyGame_Example_Monster_ref_t ref;
  void *pvVar4;
  ulong uVar5;
  flatcc_builder_ref_t *pfVar6;
  long lVar7;
  ushort uVar8;
  MyGame_Example_Monster_table_t s;
  
  if ((B->refmap != (flatcc_refmap_t *)0x0) && (fVar2 = flatcc_refmap_find(B->refmap,t), fVar2 != 0)
     ) {
    return fVar2;
  }
  iVar3 = flatcc_builder_start_table(B,0x24);
  if (iVar3 == 0) {
    if (t == (MyGame_Example_Monster_table_t)0x0) {
      __assert_fail("t__tmp != 0 && \"null pointer table access\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_reader.h"
                    ,0x43d,
                    "MyGame_Example_Vec3_struct_t MyGame_Example_Monster_pos_get(MyGame_Example_Monster_table_t)"
                   );
    }
    iVar3 = *(int *)t;
    uVar8 = *(ushort *)(t + -(long)iVar3);
    if (5 < uVar8) {
      lVar7 = -(long)iVar3;
      if (*(ushort *)(t + lVar7 + 4) != 0) {
        pvVar4 = flatcc_builder_table_add_copy(B,0,t + *(ushort *)(t + lVar7 + 4),0x20,0x10);
        if (pvVar4 == (void *)0x0) {
          return 0;
        }
        iVar3 = *(int *)t;
        lVar7 = -(long)iVar3;
        uVar8 = *(ushort *)(t + -(long)iVar3);
      }
      if (0x29 < uVar8) {
        if (*(ushort *)(t + lVar7 + 0x28) != 0) {
          pvVar4 = flatcc_builder_table_add_copy(B,0x12,t + *(ushort *)(t + lVar7 + 0x28),8,8);
          if (pvVar4 == (void *)0x0) {
            return 0;
          }
          iVar3 = *(int *)t;
          lVar7 = -(long)iVar3;
          uVar8 = *(ushort *)(t + -(long)iVar3);
        }
        if ((0x2b < uVar8) && (*(ushort *)(t + lVar7 + 0x2a) != 0)) {
          pvVar4 = flatcc_builder_table_add_copy(B,0x13,t + *(ushort *)(t + lVar7 + 0x2a),8,8);
          if (pvVar4 == (void *)0x0) {
            return 0;
          }
          iVar3 = *(int *)t;
        }
      }
    }
    lVar7 = -(long)iVar3;
    if ((0x31 < *(ushort *)(t + -(long)iVar3)) && (*(ushort *)(t + lVar7 + 0x30) != 0)) {
      pvVar4 = flatcc_builder_table_add_copy(B,0x16,t + *(ushort *)(t + lVar7 + 0x30),8,8);
      if (pvVar4 == (void *)0x0) {
        return 0;
      }
      lVar7 = -(long)*(int *)t;
    }
    if ((0x33 < *(ushort *)(t + lVar7)) && (*(ushort *)(t + lVar7 + 0x32) != 0)) {
      pvVar4 = flatcc_builder_table_add_copy(B,0x17,t + *(ushort *)(t + lVar7 + 0x32),8,8);
      if (pvVar4 == (void *)0x0) {
        return 0;
      }
      lVar7 = -(long)*(int *)t;
    }
    if ((*(ushort *)(t + lVar7) < 0xc) || (uVar5 = (ulong)*(ushort *)(t + lVar7 + 10), uVar5 == 0))
    {
      __assert_fail("!(1) && \"required field missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_reader.h"
                    ,0x440,
                    "flatbuffers_string_t MyGame_Example_Monster_name_get(MyGame_Example_Monster_table_t)"
                   );
    }
    uVar1 = *(uint *)(t + uVar5);
    s = t + uVar1 + uVar5 + 4;
    if ((B->refmap == (flatcc_refmap_t *)0x0) ||
       (fVar2 = flatcc_refmap_find(B->refmap,s), fVar2 == 0)) {
      fVar2 = flatcc_builder_create_string(B,(char *)s,(ulong)*(uint *)(t + uVar1 + uVar5));
      if (B->refmap != (flatcc_refmap_t *)0x0) {
        fVar2 = flatcc_refmap_insert(B->refmap,s,fVar2);
      }
      if (fVar2 == 0) {
        return 0;
      }
    }
    pfVar6 = flatcc_builder_table_add_offset(B,3);
    if (pfVar6 != (flatcc_builder_ref_t *)0x0) {
      *pfVar6 = fVar2;
      iVar3 = MyGame_Example_Monster_inventory_pick(B,t);
      if (((((((iVar3 == 0) &&
              (iVar3 = MyGame_Example_Monster_testarrayoftables_pick(B,t), iVar3 == 0)) &&
             (iVar3 = MyGame_Example_Monster_testarrayofstring_pick(B,t), iVar3 == 0)) &&
            ((iVar3 = MyGame_Example_Monster_testarrayofstring2_pick(B,t), iVar3 == 0 &&
             (iVar3 = MyGame_Example_Monster_testarrayofbools_pick(B,t), iVar3 == 0)))) &&
           (iVar3 = MyGame_Example_Monster_testarrayofsortedstruct_pick(B,t), iVar3 == 0)) &&
          (((((iVar3 = MyGame_Example_Monster_enemy_pick(B,t), iVar3 == 0 &&
              (iVar3 = MyGame_Example_Monster_test_pick(B,t), iVar3 == 0)) &&
             ((iVar3 = MyGame_Example_Monster_test4_pick(B,t), iVar3 == 0 &&
              (((iVar3 = MyGame_Example_Monster_test5_pick(B,t), iVar3 == 0 &&
                (iVar3 = MyGame_Example_Monster_testnestedflatbuffer_pick(B,t), iVar3 == 0)) &&
               (iVar3 = MyGame_Example_Monster_testempty_pick(B,t), iVar3 == 0)))))) &&
            (((iVar3 = MyGame_Example_Monster_testhashs32_fnv1_pick(B,t), iVar3 == 0 &&
              (iVar3 = MyGame_Example_Monster_testhashu32_fnv1_pick(B,t), iVar3 == 0)) &&
             ((iVar3 = MyGame_Example_Monster_testhashs32_fnv1a_pick(B,t), iVar3 == 0 &&
              ((((iVar3 = MyGame_Example_Monster_testhashu32_fnv1a_pick(B,t), iVar3 == 0 &&
                 (iVar3 = MyGame_Example_Monster_testf_pick(B,t), iVar3 == 0)) &&
                ((iVar3 = MyGame_Example_Monster_testf2_pick(B,t), iVar3 == 0 &&
                 (((iVar3 = MyGame_Example_Monster_testf3_pick(B,t), iVar3 == 0 &&
                   (iVar3 = MyGame_Example_Monster_flex_pick(B,t), iVar3 == 0)) &&
                  (iVar3 = MyGame_Example_Monster_vector_of_longs_pick(B,t), iVar3 == 0)))))) &&
               ((iVar3 = MyGame_Example_Monster_vector_of_doubles_pick(B,t), iVar3 == 0 &&
                (iVar3 = MyGame_Example_Monster_parent_namespace_test_pick(B,t), iVar3 == 0)))))))))
            ) && (iVar3 = MyGame_Example_Monster_testbase64_pick(B,t), iVar3 == 0)))) &&
         (((iVar3 = MyGame_Example_Monster_hp_pick(B,t), iVar3 == 0 &&
           (iVar3 = MyGame_Example_Monster_mana_pick(B,t), iVar3 == 0)) &&
          (iVar3 = MyGame_Example_Monster_color_pick(B,t), iVar3 == 0)))) {
        iVar3 = MyGame_Example_Monster_testbool_pick(B,t);
        if (iVar3 != 0) {
          return 0;
        }
        ref = MyGame_Example_Monster_end(B);
        if (B->refmap != (flatcc_refmap_t *)0x0) {
          fVar2 = flatcc_refmap_insert(B->refmap,t,ref);
          return fVar2;
        }
        return ref;
      }
    }
  }
  return 0;
}

Assistant:

static MyGame_Example_Monster_ref_t MyGame_Example_Monster_clone(flatbuffers_builder_t *B, MyGame_Example_Monster_table_t t)
{
    __flatbuffers_memoize_begin(B, t);
    if (MyGame_Example_Monster_start(B)
        || MyGame_Example_Monster_pos_pick(B, t)
        || MyGame_Example_Monster_testhashs64_fnv1_pick(B, t)
        || MyGame_Example_Monster_testhashu64_fnv1_pick(B, t)
        || MyGame_Example_Monster_testhashs64_fnv1a_pick(B, t)
        || MyGame_Example_Monster_testhashu64_fnv1a_pick(B, t)
        || MyGame_Example_Monster_name_pick(B, t)
        || MyGame_Example_Monster_inventory_pick(B, t)
        || MyGame_Example_Monster_testarrayoftables_pick(B, t)
        || MyGame_Example_Monster_testarrayofstring_pick(B, t)
        || MyGame_Example_Monster_testarrayofstring2_pick(B, t)
        || MyGame_Example_Monster_testarrayofbools_pick(B, t)
        || MyGame_Example_Monster_testarrayofsortedstruct_pick(B, t)
        || MyGame_Example_Monster_enemy_pick(B, t)
        || MyGame_Example_Monster_test_pick(B, t)
        || MyGame_Example_Monster_test4_pick(B, t)
        || MyGame_Example_Monster_test5_pick(B, t)
        || MyGame_Example_Monster_testnestedflatbuffer_pick(B, t)
        || MyGame_Example_Monster_testempty_pick(B, t)
        || MyGame_Example_Monster_testhashs32_fnv1_pick(B, t)
        || MyGame_Example_Monster_testhashu32_fnv1_pick(B, t)
        || MyGame_Example_Monster_testhashs32_fnv1a_pick(B, t)
        || MyGame_Example_Monster_testhashu32_fnv1a_pick(B, t)
        || MyGame_Example_Monster_testf_pick(B, t)
        || MyGame_Example_Monster_testf2_pick(B, t)
        || MyGame_Example_Monster_testf3_pick(B, t)
        || MyGame_Example_Monster_flex_pick(B, t)
        || MyGame_Example_Monster_vector_of_longs_pick(B, t)
        || MyGame_Example_Monster_vector_of_doubles_pick(B, t)
        || MyGame_Example_Monster_parent_namespace_test_pick(B, t)
        || MyGame_Example_Monster_testbase64_pick(B, t)
        || MyGame_Example_Monster_hp_pick(B, t)
        || MyGame_Example_Monster_mana_pick(B, t)
        || MyGame_Example_Monster_color_pick(B, t)
        || MyGame_Example_Monster_testbool_pick(B, t)) {
        return 0;
    }
    __flatbuffers_memoize_end(B, t, MyGame_Example_Monster_end(B));
}